

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O3

secp256k1_scratch * secp256k1_scratch_create(secp256k1_callback *error_callback,size_t size)

{
  secp256k1_scratch *psVar1;
  
  psVar1 = (secp256k1_scratch *)malloc(size + 0x20);
  if (psVar1 == (secp256k1_scratch *)0x0) {
    (*error_callback->fn)("Out of memory",error_callback->data);
  }
  else {
    psVar1->alloc_size = 0;
    builtin_memcpy(psVar1->magic,"scratch",8);
    psVar1->data = psVar1 + 1;
    psVar1->max_size = size;
  }
  return psVar1;
}

Assistant:

static secp256k1_scratch* secp256k1_scratch_create(const secp256k1_callback* error_callback, size_t size) {
    const size_t base_alloc = ROUND_TO_ALIGN(sizeof(secp256k1_scratch));
    void *alloc = checked_malloc(error_callback, base_alloc + size);
    secp256k1_scratch* ret = (secp256k1_scratch *)alloc;
    if (ret != NULL) {
        memset(ret, 0, sizeof(*ret));
        memcpy(ret->magic, "scratch", 8);
        ret->data = (void *) ((char *) alloc + base_alloc);
        ret->max_size = size;
    }
    return ret;
}